

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int phf_keycmp<std::__cxx11::string>
              (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *a,phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *b)

{
  uint uVar1;
  uint uVar2;
  size_t __n;
  __type_conflict _Var3;
  int iVar4;
  bool bVar5;
  
  iVar4 = -1;
  if (*a->n <= *b->n) {
    if (*a->n < *b->n) {
      iVar4 = 1;
    }
    else {
      uVar1 = b->g;
      uVar2 = a->g;
      if ((uVar1 > uVar2 || uVar2 == uVar1) && (iVar4 = 1, uVar1 <= uVar2)) {
        __n = (a->k)._M_string_length;
        bVar5 = true;
        if (__n == (b->k)._M_string_length) {
          if (__n == 0) {
            bVar5 = false;
          }
          else {
            iVar4 = bcmp((a->k)._M_dataplus._M_p,(b->k)._M_dataplus._M_p,__n);
            bVar5 = iVar4 != 0;
          }
        }
        iVar4 = 0;
        if ((a != b) && (!bVar5)) {
          _Var3 = std::operator==(&a->k,&b->k);
          if (_Var3) {
            __assert_fail("!(a->k == b->k)",
                          "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                          ,0x1e4,
                          "int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = std::basic_string<char>]"
                         );
          }
          abort();
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}